

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptConstFoldBinaryWasm<long>
          (GlobOpt *this,Instr **pInstr,Value *src1,Value *src2,Value **pDstVal)

{
  Instr *pIVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  JITTimeFunctionBody *this_00;
  Opnd *this_01;
  RegOpnd *dst_00;
  Opnd *local_88;
  Opnd *dst;
  int64 tmpValueOut;
  long src2IntConstantValue;
  long src1IntConstantValue;
  Instr **instr;
  Value **pDstVal_local;
  Value *src2_local;
  Value *src1_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  src1IntConstantValue = (long)pInstr;
  instr = (Instr **)pDstVal;
  pDstVal_local = (Value **)src2;
  src2_local = src1;
  src1_local = (Value *)pInstr;
  pInstr_local = (Instr **)this;
  bVar2 = DoConstFold(this);
  if ((bVar2) && (src2_local != (Value *)0x0)) {
    pVVar3 = ::Value::GetValueInfo(src2_local);
    bVar2 = ValueInfo::TryGetIntConstantValue(pVVar3,&src2IntConstantValue,false);
    if ((bVar2) && (pDstVal_local != (Value **)0x0)) {
      pVVar3 = ::Value::GetValueInfo((Value *)pDstVal_local);
      bVar2 = ValueInfo::TryGetIntConstantValue(pVVar3,&tmpValueOut,false);
      if (bVar2) {
        pIVar1 = *(Instr **)src1IntConstantValue;
        this_00 = Func::GetJITFunctionBody(this->func);
        bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
        bVar2 = IR::Instr::BinaryCalculatorT<long>
                          (pIVar1,src2IntConstantValue,tmpValueOut,(int64 *)&dst,bVar2);
        if (bVar2) {
          CaptureByteCodeSymUses(this,*(Instr **)src1IntConstantValue);
          this_01 = IR::Instr::GetDst(*(Instr **)src1IntConstantValue);
          bVar2 = IR::Opnd::IsInt64(this_01);
          if (bVar2) {
            local_88 = ReplaceWConst<long>(this,(Instr **)src1_local,(long)dst,(Value **)instr);
          }
          else {
            local_88 = ReplaceWConst<int>(this,(Instr **)src1_local,(int)dst,(Value **)instr);
          }
          *(undefined2 *)(*(long *)src1IntConstantValue + 0x30) = 0x1e4;
          pIVar1 = *(Instr **)src1IntConstantValue;
          dst_00 = IR::Opnd::AsRegOpnd(local_88);
          ToInt32Dst(this,pIVar1,dst_00,this->currentBlock);
          return true;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool GlobOpt::OptConstFoldBinaryWasm(
    IR::Instr** pInstr,
    const Value* src1,
    const Value* src2,
    Value **pDstVal)
{
    IR::Instr* &instr = *pInstr;

    if (!DoConstFold())
    {
        return false;
    }

    T src1IntConstantValue, src2IntConstantValue;
    if (!src1 || !src1->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue, false) || //a bit sketchy: false for int32 means likelyInt = false
        !src2 || !src2->GetValueInfo()->TryGetIntConstantValue(&src2IntConstantValue, false)    //and unsigned = false for int64
        )
    {
        return false;
    }

    int64 tmpValueOut;
    if (!instr->BinaryCalculatorT<T>(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, func->GetJITFunctionBody()->IsWasmFunction()))
    {
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    IR::Opnd *dst = (instr->GetDst()->IsInt64()) ? //dst can be int32 for int64 comparison operators
        ReplaceWConst(pInstr, tmpValueOut, pDstVal) :
        ReplaceWConst(pInstr, (int)tmpValueOut, pDstVal);

    instr->m_opcode = Js::OpCode::Ld_I4;
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    return true;
}